

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O2

ostream * GenApi_3_4::operator<<(ostream *os,CFeatureBag *FeatureBag)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  gcstring *pgVar4;
  char *pcVar5;
  long lVar6;
  const_iterator end;
  const_iterator it;
  gcstring Value;
  gcstring Name;
  gcstring local_d0 [80];
  gcstring local_80 [80];
  
  std::operator<<(os,"# {05D8C294-F295-4dfb-9D01-096BD04049F4}\n");
  plVar2 = (long *)GenApi_3_4::CFeatureBag::GetInfo();
  cVar1 = (**(code **)(*plVar2 + 0x50))(plVar2);
  if (cVar1 == '\0') {
    poVar3 = std::operator<<(os,"# GenApi persistence file (version ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,3);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,4);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(os,"# ");
    pgVar4 = (gcstring *)GenApi_3_4::CFeatureBag::GetInfo();
    pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(pgVar4);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,"\n");
  }
  GenApi_3_4::CFeatureBag::GetBegin();
  GenApi_3_4::CFeatureBag::GetEnd();
  while( true ) {
    cVar1 = GenApi_3_4::CFeatureBag::const_iterator::operator!=(&it,&end);
    if (cVar1 == '\0') break;
    pgVar4 = (gcstring *)GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
    GenICam_3_4::gcstring::gcstring(&Name,pgVar4);
    lVar6 = GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
    GenICam_3_4::gcstring::gcstring(&Value,(gcstring *)(lVar6 + 0x50));
    GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
    cVar1 = GenApi_3_4::CSelectorState::IsEmpty();
    if (cVar1 == '\0') {
      pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(&Name);
      poVar3 = std::operator<<(os,pcVar5);
      std::operator<<(poVar3,"\t{");
      GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
      GenApi_3_4::CSelectorState::SetFirst();
      while( true ) {
        GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
        GenApi_3_4::CSelectorState::GetNodeName();
        pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(local_80);
        poVar3 = std::operator<<(os,pcVar5);
        poVar3 = std::operator<<(poVar3,"=");
        GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
        GenApi_3_4::CSelectorState::GetNodeValue();
        pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(local_d0);
        std::operator<<(poVar3,pcVar5);
        GenICam_3_4::gcstring::~gcstring(local_d0);
        GenICam_3_4::gcstring::~gcstring(local_80);
        GenApi_3_4::CFeatureBag::const_iterator::operator->(&it);
        cVar1 = GenApi_3_4::CSelectorState::SetNext();
        if (cVar1 == '\0') break;
        std::operator<<(os,"\t");
      }
      poVar3 = std::operator<<(os,"}\t");
      pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(&Value);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::operator<<(poVar3,"\n");
    }
    else {
      pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(&Name);
      poVar3 = std::operator<<(os,pcVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(&Value);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::operator<<(poVar3,"\n");
    }
    GenICam_3_4::gcstring::~gcstring(&Value);
    GenICam_3_4::gcstring::~gcstring(&Name);
    GenApi_3_4::CFeatureBag::const_iterator::operator++(&it);
  }
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream &os, const CFeatureBag &FeatureBag)
    {
        os << "# " GENAPI_PERSISTENCE_MAGIC "\n";
        if( !FeatureBag.GetInfo().empty() )
        {
            os << "# GenApi persistence file (version " << GENAPI_VERSION_MAJOR << "." << GENAPI_VERSION_MINOR << "." << GENAPI_VERSION_SUBMINOR << ")\n";
            os << "# " << FeatureBag.GetInfo() << "\n";
        }
        for (
            CFeatureBag::const_iterator it = FeatureBag.GetBegin(), end = FeatureBag.GetEnd();
            it != end;
            ++it
            )
        {
            const GENICAM_NAMESPACE::gcstring Name(it->name);
            const GENICAM_NAMESPACE::gcstring Value(it->value);
            if ((it->pState)->IsEmpty())
            {
                os << Name << "\t" << Value << "\n";
            }
            else
            {
                bool isFirst = true;
                os << Name << "\t{";
                (it->pState)->SetFirst();
                do
                {
                    if (!isFirst)
                        os << "\t";
                    else
                        isFirst = false;
                    os << (it->pState)->GetNodeName() << "=" << (it->pState)->GetNodeValue();
                } while ((it->pState)->SetNext());
                os << "}\t" << Value << "\n";
            }
        }

        return os;
    }